

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

Status __thiscall wallet::SQLiteCursor::Next(SQLiteCursor *this,DataStream *key,DataStream *value)

{
  string_view source_file;
  int iVar1;
  DataStream *pDVar2;
  DataStream *in_RDX;
  DataStream *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  string_view in_stack_00000000;
  int res;
  Level in_stack_000000e0;
  char (*in_stack_000000f0) [5];
  char **in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  void *local_78;
  void *local_68;
  char *flag;
  Status local_34;
  ConstevalFormatString<2U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  iVar1 = sqlite3_step(*(undefined8 *)(in_RDI + 8));
  if (iVar1 == 0x65) {
    local_34 = DONE;
  }
  else if (iVar1 == 100) {
    DataStream::clear((DataStream *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    iVar1 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    DataStream::clear((DataStream *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pDVar2 = in_RSI;
    SVar3 = SpanFromBlob((sqlite3_stmt *)in_stack_ffffffffffffff58,iVar1);
    local_68 = (void *)SVar3.m_size;
    DataStream::write(in_RSI,(int)SVar3.m_data,local_68,(size_t)pDVar2);
    pDVar2 = in_RDX;
    SVar3 = SpanFromBlob((sqlite3_stmt *)in_stack_ffffffffffffff58,iVar1);
    local_78 = (void *)SVar3.m_size;
    DataStream::write(in_RDX,(int)SVar3.m_data,local_78,(size_t)pDVar2);
    local_34 = MORE;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    flag = "%s: Unable to execute cursor step: %s\n";
    sqlite3_errstr(iVar1);
    source_file._M_str = pcVar4;
    source_file._M_len = in_stack_fffffffffffffff0;
    LogPrintFormatInternal<char[5],char_const*>
              (in_stack_00000000,source_file,iVar1,(LogFlags)flag,in_stack_000000e0,
               in_stack_ffffffffffffffe8,in_stack_000000f0,in_stack_000000f8);
    local_34 = FAIL;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar4) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status SQLiteCursor::Next(DataStream& key, DataStream& value)
{
    int res = sqlite3_step(m_cursor_stmt);
    if (res == SQLITE_DONE) {
        return Status::DONE;
    }
    if (res != SQLITE_ROW) {
        LogPrintf("%s: Unable to execute cursor step: %s\n", __func__, sqlite3_errstr(res));
        return Status::FAIL;
    }

    key.clear();
    value.clear();

    // Leftmost column in result is index 0
    key.write(SpanFromBlob(m_cursor_stmt, 0));
    value.write(SpanFromBlob(m_cursor_stmt, 1));
    return Status::MORE;
}